

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchic_fe.h
# Opt level: O0

Matrix<double,_1,__1,_1,_1,__1> __thiscall
lf::fe::FeHierarchicTria<double>::NodalValuesToVertexDofs
          (FeHierarchicTria<double> *this,Matrix<double,_1,__1,_1,_1,__1> *nodevals)

{
  double dVar1;
  CoeffReturnType pdVar2;
  Scalar *pSVar3;
  DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0> *in_RDX;
  Index extraout_RDX;
  Matrix<double,_1,__1,_1,_1,__1> MVar4;
  int local_28;
  undefined1 local_21;
  DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0> *local_20;
  Matrix<double,_1,__1,_1,_1,__1> *nodevals_local;
  FeHierarchicTria<double> *this_local;
  Matrix<double,_1,__1,_1,_1,__1> *dofs;
  
  local_21 = 0;
  local_28 = 3;
  local_20 = in_RDX;
  nodevals_local = nodevals;
  this_local = this;
  Eigen::Matrix<double,_1,_-1,_1,_1,_-1>::Matrix<int>
            ((Matrix<double,_1,__1,_1,_1,__1> *)this,&local_28);
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[](local_20,0)
  ;
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1> *)this,0);
  *pSVar3 = dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[](local_20,1)
  ;
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1> *)this,1);
  *pSVar3 = dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[](local_20,2)
  ;
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1> *)this,2);
  *pSVar3 = dVar1;
  MVar4.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols =
       extraout_RDX;
  MVar4.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_data =
       (double *)this;
  return (Matrix<double,_1,__1,_1,_1,__1>)
         MVar4.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage;
}

Assistant:

[[nodiscard]] Eigen::Matrix<SCALAR, 1, Eigen::Dynamic>
  NodalValuesToVertexDofs(
      const Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> &nodevals) const {
    Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> dofs(3);
    dofs[0] = nodevals[0];
    dofs[1] = nodevals[1];
    dofs[2] = nodevals[2];
    return dofs;
  }